

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall
cmFindLibraryCommand::InitialPass
          (cmFindLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  cmValue cVar4;
  cmState *pcVar5;
  pointer suffix;
  string library;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).super_cmFindCommon.CMakePathName);
  iVar3 = (*(this->super_cmFindBase)._vptr_cmFindBase[2])(this,argsIn);
  bVar1 = SUB41(iVar3,0);
  if (bVar1 == false) {
    return false;
  }
  bVar2 = cmFindCommon::ComputeIfDebugModeWanted
                    (&(this->super_cmFindBase).super_cmFindCommon,
                     &(this->super_cmFindBase).VariableName);
  (this->super_cmFindBase).super_cmFindCommon.DebugMode = bVar2;
  if ((this->super_cmFindBase).AlreadyDefined == true) {
    cmFindBase::NormalizeFindResult(&this->super_cmFindBase);
    return bVar1;
  }
  this_00 = (this->super_cmFindBase).super_cmFindCommon.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX",&local_41);
  cVar4 = cmMakefile::GetDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (cVar4.Value == (string *)0x0) {
    bVar2 = cmMakefile::PlatformIs32Bit((this->super_cmFindBase).super_cmFindCommon.Makefile);
    if (bVar2) {
      pcVar5 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"FIND_LIBRARY_USE_LIB32_PATHS",&local_41);
      bVar2 = cmState::GetGlobalPropertyAsBool(pcVar5,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar2) {
        suffix = "32";
        goto LAB_0021f52f;
      }
    }
    bVar2 = cmMakefile::PlatformIs64Bit((this->super_cmFindBase).super_cmFindCommon.Makefile);
    if (bVar2) {
      pcVar5 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"FIND_LIBRARY_USE_LIB64_PATHS",&local_41);
      bVar2 = cmState::GetGlobalPropertyAsBool(pcVar5,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar2) {
        suffix = "64";
        goto LAB_0021f52f;
      }
    }
    bVar2 = cmMakefile::PlatformIsx32((this->super_cmFindBase).super_cmFindCommon.Makefile);
    if (!bVar2) goto LAB_0021f537;
    pcVar5 = cmMakefile::GetState((this->super_cmFindBase).super_cmFindCommon.Makefile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"FIND_LIBRARY_USE_LIBX32_PATHS",&local_41);
    bVar2 = cmState::GetGlobalPropertyAsBool(pcVar5,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar2) goto LAB_0021f537;
    suffix = "x32";
  }
  else {
    suffix = ((cVar4.Value)->_M_dataplus)._M_p;
  }
LAB_0021f52f:
  AddArchitecturePaths(this,suffix);
LAB_0021f537:
  FindLibrary_abi_cxx11_(&local_40,this);
  cmFindBase::StoreFindResult(&this->super_cmFindBase,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool cmFindLibraryCommand::InitialPass(std::vector<std::string> const& argsIn)
{
  this->CMakePathName = "LIBRARY";

  if (!this->ParseArguments(argsIn)) {
    return false;
  }

  this->DebugMode = this->ComputeIfDebugModeWanted(this->VariableName);

  if (this->AlreadyDefined) {
    this->NormalizeFindResult();
    return true;
  }

  // add custom lib<qual> paths instead of using fixed lib32, lib64 or
  // libx32
  if (cmValue customLib = this->Makefile->GetDefinition(
        "CMAKE_FIND_LIBRARY_CUSTOM_LIB_SUFFIX")) {
    this->AddArchitecturePaths(customLib->c_str());
  }
  // add special 32 bit paths if this is a 32 bit compile.
  else if (this->Makefile->PlatformIs32Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB32_PATHS")) {
    this->AddArchitecturePaths("32");
  }
  // add special 64 bit paths if this is a 64 bit compile.
  else if (this->Makefile->PlatformIs64Bit() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIB64_PATHS")) {
    this->AddArchitecturePaths("64");
  }
  // add special 32 bit paths if this is an x32 compile.
  else if (this->Makefile->PlatformIsx32() &&
           this->Makefile->GetState()->GetGlobalPropertyAsBool(
             "FIND_LIBRARY_USE_LIBX32_PATHS")) {
    this->AddArchitecturePaths("x32");
  }

  std::string const library = this->FindLibrary();
  this->StoreFindResult(library);
  return true;
}